

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O2

Rect __thiscall lunasvg::SVGElement::paintBoundingBox(SVGElement *this)

{
  Rect *this_00;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float fVar1;
  undefined8 uVar2;
  Rect local_20;
  
  uVar2 = 0;
  if (((this->m_paintBoundingBox).w < 0.0) || ((this->m_paintBoundingBox).h < 0.0)) {
    this_00 = &this->m_paintBoundingBox;
    this_00->x = 0.0;
    (this->m_paintBoundingBox).y = 0.0;
    (this->m_paintBoundingBox).w = 0.0;
    (this->m_paintBoundingBox).h = 0.0;
    (*(this->super_SVGNode)._vptr_SVGNode[0xc])(this);
    fVar1 = (float)((ulong)uVar2 >> 0x20);
    (this->m_paintBoundingBox).x = extraout_XMM0_Da;
    (this->m_paintBoundingBox).y = extraout_XMM0_Db;
    (this->m_paintBoundingBox).w = (float)uVar2;
    (this->m_paintBoundingBox).h = fVar1;
    if (((float)uVar2 < 0.0) || (fVar1 < 0.0)) {
      __assert_fail("m_paintBoundingBox.isValid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgelement.cpp"
                    ,0x141,"virtual Rect lunasvg::SVGElement::paintBoundingBox() const");
    }
    if (this->m_clipper != (SVGClipPathElement *)0x0) {
      local_20 = SVGClipPathElement::clipBoundingBox(this->m_clipper,this);
      Rect::intersect(this_00,&local_20);
    }
    if (this->m_masker != (SVGMaskElement *)0x0) {
      local_20 = SVGMaskElement::maskBoundingBox(this->m_masker,this);
      Rect::intersect(this_00,&local_20);
    }
  }
  return this->m_paintBoundingBox;
}

Assistant:

Rect SVGElement::paintBoundingBox() const
{
    if(m_paintBoundingBox.isValid())
        return m_paintBoundingBox;
    m_paintBoundingBox = Rect::Empty;
    m_paintBoundingBox = strokeBoundingBox();
    assert(m_paintBoundingBox.isValid());
    if(m_clipper) m_paintBoundingBox.intersect(m_clipper->clipBoundingBox(this));
    if(m_masker) m_paintBoundingBox.intersect(m_masker->maskBoundingBox(this));
    return m_paintBoundingBox;
}